

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accumulate.cc
# Opt level: O0

void accumulate_avg(vw *all,parameters *weights,size_t offset)

{
  float fVar1;
  uint uVar2;
  uint32_t uVar3;
  ulong uVar4;
  void *pvVar5;
  weight *pwVar6;
  dense_parameters *this;
  long in_RDX;
  byte *in_RSI;
  long in_RDI;
  float fVar7;
  uint64_t i_3;
  uint64_t i_2;
  uint64_t i_1;
  uint64_t i;
  float *local_grad;
  float numnodes;
  uint32_t length;
  size_t in_stack_ffffffffffffff60;
  float *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  byte *in_stack_ffffffffffffffa8;
  float fVar8;
  float fVar9;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  ulong local_30;
  
  uVar2 = 1 << (*(byte *)(in_RDI + 0x50) & 0x1f);
  uVar4 = *(ulong *)(*(long *)(in_RDI + 0x20) + 8);
  fVar7 = (float)(long)uVar4;
  fVar8 = (float)uVar4;
  uVar4 = SUB168(ZEXT416(uVar2) * ZEXT816(4),0);
  if (SUB168(ZEXT416(uVar2) * ZEXT816(4),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  fVar9 = fVar8;
  pvVar5 = operator_new__(uVar4);
  if ((*in_RSI & 1) == 0) {
    for (local_38 = 0; local_38 < uVar2; local_38 = local_38 + 1) {
      uVar3 = dense_parameters::stride_shift((dense_parameters *)(in_RSI + 8));
      pwVar6 = dense_parameters::operator[]
                         ((dense_parameters *)(in_RSI + 8),local_38 << ((byte)uVar3 & 0x3f));
      *(weight *)((long)pvVar5 + local_38 * 4) = pwVar6[in_RDX];
    }
  }
  else {
    for (local_30 = 0; local_30 < uVar2; local_30 = local_30 + 1) {
      in_stack_ffffffffffffffa8 = in_RSI + 0x20;
      sparse_parameters::stride_shift((sparse_parameters *)(in_RSI + 0x20));
      pwVar6 = sparse_parameters::operator[]
                         ((sparse_parameters *)CONCAT44(fVar9,fVar7),
                          (size_t)in_stack_ffffffffffffffa8);
      *(weight *)((long)pvVar5 + local_30 * 4) = pwVar6[in_RDX];
    }
  }
  all_reduce<float,_&add_float>
            ((vw *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  if ((*in_RSI & 1) == 0) {
    for (local_48 = 0; local_48 < uVar2; local_48 = local_48 + 1) {
      fVar7 = *(float *)((long)pvVar5 + local_48 * 4) / fVar8;
      this = (dense_parameters *)(in_RSI + 8);
      uVar4 = local_48;
      uVar3 = dense_parameters::stride_shift((dense_parameters *)(in_RSI + 8));
      pwVar6 = dense_parameters::operator[](this,uVar4 << ((byte)uVar3 & 0x3f));
      pwVar6[in_RDX] = fVar7;
    }
  }
  else {
    for (local_40 = 0; local_40 < uVar2; local_40 = local_40 + 1) {
      fVar1 = *(float *)((long)pvVar5 + local_40 * 4);
      sparse_parameters::stride_shift((sparse_parameters *)(in_RSI + 0x20));
      pwVar6 = sparse_parameters::operator[]
                         ((sparse_parameters *)CONCAT44(fVar9,fVar7),
                          (size_t)in_stack_ffffffffffffffa8);
      pwVar6[in_RDX] = fVar1 / fVar8;
    }
  }
  if (pvVar5 != (void *)0x0) {
    operator_delete__(pvVar5);
  }
  return;
}

Assistant:

void accumulate_avg(vw& all, parameters& weights, size_t offset)
{
  uint32_t length = 1 << all.num_bits;  // This is size of gradient
  float numnodes = (float)all.all_reduce->total;
  float* local_grad = new float[length];

  if (weights.sparse)
    for (uint64_t i = 0; i < length; i++)
      local_grad[i] = (&(weights.sparse_weights[i << weights.sparse_weights.stride_shift()]))[offset];
  else
    for (uint64_t i = 0; i < length; i++)
      local_grad[i] = (&(weights.dense_weights[i << weights.dense_weights.stride_shift()]))[offset];

  all_reduce<float, add_float>(all, local_grad, length);  // TODO: modify to not use first()

  if (weights.sparse)
    for (uint64_t i = 0; i < length; i++)
      (&(weights.sparse_weights[i << weights.sparse_weights.stride_shift()]))[offset] = local_grad[i] / numnodes;
  else
    for (uint64_t i = 0; i < length; i++)
      (&(weights.dense_weights[i << weights.dense_weights.stride_shift()]))[offset] = local_grad[i] / numnodes;

  delete[] local_grad;
}